

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O3

Result * CoreML::validateGeneralWeightParams
                   (Result *__return_storage_ptr__,WeightParams *weight,uint64_t expectedUnits,
                   uint64_t outChannels,string *layerClassName,string *layerName,string *weightName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  long lVar4;
  pointer pcVar5;
  uint uVar6;
  char cVar7;
  bool bVar8;
  ulong uVar9;
  undefined8 *puVar10;
  long *plVar11;
  uint uVar12;
  ulong *puVar13;
  size_type *psVar14;
  long *plVar15;
  uint64_t uVar16;
  char cVar17;
  ulong uVar18;
  string err;
  string __str_3;
  Result r;
  ulong *local_1c0;
  long local_1b8;
  ulong local_1b0;
  long lStack_1a8;
  long *local_1a0;
  undefined8 local_198;
  long local_190;
  undefined8 uStack_188;
  ulong *local_180;
  long local_178;
  ulong local_170;
  long lStack_168;
  long *local_160;
  undefined8 local_158;
  long local_150;
  undefined8 uStack_148;
  string local_140;
  uint64_t local_120;
  ulong *local_118;
  long local_110;
  ulong local_108;
  long lStack_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  ulong *local_b8;
  uint local_b0;
  undefined4 uStack_ac;
  ulong local_a8 [2];
  ulong *local_98;
  uint local_90;
  undefined4 uStack_8c;
  ulong local_88 [2];
  long *local_78 [2];
  long local_68 [2];
  Result local_58;
  
  local_120 = expectedUnits;
  Result::Result(&local_58);
  iVar3 = (weight->floatvalue_).current_size_;
  uVar9 = (ulong)iVar3;
  uVar18 = *(ulong *)(((ulong)(weight->float16value_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  uVar12 = (0 < (long)uVar9) + 1;
  if (uVar18 == 0) {
    uVar12 = (uint)(0 < (long)uVar9);
  }
  lVar4 = *(long *)(((ulong)(weight->rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  uVar6 = (uint)(*(long *)(((ulong)(weight->int8rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) +
                          8) == 0);
  uVar12 = (uVar12 - (lVar4 == 0)) + 2;
  if (uVar12 - uVar6 < 2) {
    if (((uVar18 == 0) && (uVar12 != uVar6)) && (iVar3 < 1)) {
      if (((lVar4 == 0) ||
          (weight == (WeightParams *)Specification::_WeightParams_default_instance_)) ||
         (weight->quantization_ == (QuantizationParams *)0x0)) {
LAB_00358f94:
        pcVar5 = (layerClassName->_M_dataplus)._M_p;
        local_1c0 = &local_1b0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c0,pcVar5,pcVar5 + layerClassName->_M_string_length);
        std::__cxx11::string::append((char *)&local_1c0);
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_1c0,(ulong)(layerName->_M_dataplus)._M_p);
        plVar11 = puVar10 + 2;
        if ((long *)*puVar10 == plVar11) {
          local_150 = *plVar11;
          uStack_148 = puVar10[3];
          local_160 = &local_150;
        }
        else {
          local_150 = *plVar11;
          local_160 = (long *)*puVar10;
        }
        local_158 = puVar10[1];
        *puVar10 = plVar11;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_160);
        puVar13 = (ulong *)(plVar11 + 2);
        if ((ulong *)*plVar11 == puVar13) {
          local_170 = *puVar13;
          lStack_168 = plVar11[3];
          local_180 = &local_170;
        }
        else {
          local_170 = *puVar13;
          local_180 = (ulong *)*plVar11;
        }
        local_178 = plVar11[1];
        *plVar11 = (long)puVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_180,(ulong)(weightName->_M_dataplus)._M_p);
        plVar11 = puVar10 + 2;
        if ((long *)*puVar10 == plVar11) {
          local_190 = *plVar11;
          uStack_188 = puVar10[3];
          local_1a0 = &local_190;
        }
        else {
          local_190 = *plVar11;
          local_1a0 = (long *)*puVar10;
        }
        local_198 = puVar10[1];
        *puVar10 = plVar11;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a0);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        psVar14 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_140.field_2._M_allocated_capacity = *psVar14;
          local_140.field_2._8_8_ = puVar10[3];
        }
        else {
          local_140.field_2._M_allocated_capacity = *psVar14;
          local_140._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_140._M_string_length = puVar10[1];
        *puVar10 = psVar14;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        if (local_1a0 != &local_190) {
          operator_delete(local_1a0,local_190 + 1);
        }
        if (local_180 != &local_170) {
          operator_delete(local_180,local_170 + 1);
        }
        if (local_160 != &local_150) {
          operator_delete(local_160,local_150 + 1);
        }
        if (local_1c0 != &local_1b0) {
          operator_delete(local_1c0,local_1b0 + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_140);
        goto LAB_00359353;
      }
      bVar8 = hasSufficientBytesInQuantizedWeightParam(weight,local_120);
      if (bVar8) {
        bVar8 = hasValidQuantizationParams(weight,(int)outChannels);
        if (bVar8) goto LAB_00358f57;
        pcVar5 = (layerClassName->_M_dataplus)._M_p;
        local_1c0 = &local_1b0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c0,pcVar5,pcVar5 + layerClassName->_M_string_length);
        std::__cxx11::string::append((char *)&local_1c0);
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_1c0,(ulong)(layerName->_M_dataplus)._M_p);
        plVar11 = puVar10 + 2;
        if ((long *)*puVar10 == plVar11) {
          local_150 = *plVar11;
          uStack_148 = puVar10[3];
          local_160 = &local_150;
        }
        else {
          local_150 = *plVar11;
          local_160 = (long *)*puVar10;
        }
        local_158 = puVar10[1];
        *puVar10 = plVar11;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_160);
        puVar13 = (ulong *)(plVar11 + 2);
        if ((ulong *)*plVar11 == puVar13) {
          local_170 = *puVar13;
          lStack_168 = plVar11[3];
          local_180 = &local_170;
        }
        else {
          local_170 = *puVar13;
          local_180 = (ulong *)*plVar11;
        }
        local_178 = plVar11[1];
        *plVar11 = (long)puVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_180,(ulong)(weightName->_M_dataplus)._M_p);
        plVar11 = puVar10 + 2;
        if ((long *)*puVar10 == plVar11) {
          local_190 = *plVar11;
          uStack_188 = puVar10[3];
          local_1a0 = &local_190;
        }
        else {
          local_190 = *plVar11;
          local_1a0 = (long *)*puVar10;
        }
        local_198 = puVar10[1];
        *puVar10 = plVar11;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a0);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        psVar14 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_140.field_2._M_allocated_capacity = *psVar14;
          local_140.field_2._8_8_ = puVar10[3];
        }
        else {
          local_140.field_2._M_allocated_capacity = *psVar14;
          local_140._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_140._M_string_length = puVar10[1];
        *puVar10 = psVar14;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        if (local_1a0 != &local_190) {
          operator_delete(local_1a0,local_190 + 1);
        }
        if (local_180 != &local_170) {
          operator_delete(local_180,local_170 + 1);
        }
        if (local_160 != &local_150) {
          operator_delete(local_160,local_150 + 1);
        }
        if (local_1c0 != &local_1b0) {
          operator_delete(local_1c0,local_1b0 + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_140);
        goto LAB_00359353;
      }
      pcVar5 = (layerClassName->_M_dataplus)._M_p;
      local_d8 = &local_c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,pcVar5,pcVar5 + layerClassName->_M_string_length);
      std::__cxx11::string::append((char *)&local_d8);
      plVar11 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_d8,(ulong)(layerName->_M_dataplus)._M_p);
      local_f8 = &local_e8;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_e8 = *plVar15;
        lStack_e0 = plVar11[3];
      }
      else {
        local_e8 = *plVar15;
        local_f8 = (long *)*plVar11;
      }
      local_f0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_f8);
      puVar13 = (ulong *)(plVar11 + 2);
      if ((ulong *)*plVar11 == puVar13) {
        local_1b0 = *puVar13;
        lStack_1a8 = plVar11[3];
        local_1c0 = &local_1b0;
      }
      else {
        local_1b0 = *puVar13;
        local_1c0 = (ulong *)*plVar11;
      }
      local_1b8 = plVar11[1];
      *plVar11 = (long)puVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_1c0,(ulong)(weightName->_M_dataplus)._M_p);
      plVar11 = puVar10 + 2;
      if ((long *)*puVar10 == plVar11) {
        local_150 = *plVar11;
        uStack_148 = puVar10[3];
        local_160 = &local_150;
      }
      else {
        local_150 = *plVar11;
        local_160 = (long *)*puVar10;
      }
      local_158 = puVar10[1];
      *puVar10 = plVar11;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_160);
      puVar13 = (ulong *)(plVar11 + 2);
      if ((ulong *)*plVar11 == puVar13) {
        local_170 = *puVar13;
        lStack_168 = plVar11[3];
        local_180 = &local_170;
      }
      else {
        local_170 = *puVar13;
        local_180 = (ulong *)*plVar11;
      }
      local_178 = plVar11[1];
      *plVar11 = (long)puVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      cVar17 = '\x01';
      if (9 < local_120) {
        uVar16 = local_120;
        cVar7 = '\x04';
        do {
          cVar17 = cVar7;
          if (uVar16 < 100) {
            cVar17 = cVar17 + -2;
            goto LAB_00359e1f;
          }
          if (uVar16 < 1000) {
            cVar17 = cVar17 + -1;
            goto LAB_00359e1f;
          }
          if (uVar16 < 10000) goto LAB_00359e1f;
          bVar8 = 99999 < uVar16;
          uVar16 = uVar16 / 10000;
          cVar7 = cVar17 + '\x04';
        } while (bVar8);
        cVar17 = cVar17 + '\x01';
      }
LAB_00359e1f:
      local_118 = &local_108;
      std::__cxx11::string::_M_construct((ulong)&local_118,cVar17);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_118,(uint)local_110,local_120);
      uVar18 = 0xf;
      if (local_180 != &local_170) {
        uVar18 = local_170;
      }
      if (uVar18 < (ulong)(local_110 + local_178)) {
        uVar18 = 0xf;
        if (local_118 != &local_108) {
          uVar18 = local_108;
        }
        if (uVar18 < (ulong)(local_110 + local_178)) goto LAB_00359ea1;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_180);
      }
      else {
LAB_00359ea1:
        puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_118)
        ;
      }
      local_1a0 = &local_190;
      plVar11 = puVar10 + 2;
      if ((long *)*puVar10 == plVar11) {
        local_190 = *plVar11;
        uStack_188 = puVar10[3];
      }
      else {
        local_190 = *plVar11;
        local_1a0 = (long *)*puVar10;
      }
      local_198 = puVar10[1];
      *puVar10 = plVar11;
      puVar10[1] = 0;
      *(undefined1 *)plVar11 = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a0);
      psVar14 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_140.field_2._M_allocated_capacity = *psVar14;
        local_140.field_2._8_8_ = puVar10[3];
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      }
      else {
        local_140.field_2._M_allocated_capacity = *psVar14;
        local_140._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_140._M_string_length = puVar10[1];
      *puVar10 = psVar14;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      if (local_1a0 != &local_190) {
        operator_delete(local_1a0,local_190 + 1);
      }
      if (local_118 != &local_108) {
        operator_delete(local_118,local_108 + 1);
      }
      if (local_180 != &local_170) {
        operator_delete(local_180,local_170 + 1);
      }
      if (local_160 != &local_150) {
        operator_delete(local_160,local_150 + 1);
      }
      if (local_1c0 != &local_1b0) {
        operator_delete(local_1c0,local_1b0 + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p == &local_140.field_2) goto LAB_00359370;
    }
    else {
      if (uVar12 == uVar6) goto LAB_00358f94;
      uVar18 = uVar18 >> 1;
      if (0 < iVar3) {
        uVar18 = uVar9;
      }
      if (uVar18 == local_120) {
LAB_00358f57:
        paVar2 = &local_58.m_message.field_2;
        __return_storage_ptr__->m_type = local_58.m_type;
        __return_storage_ptr__->m_reason = local_58.m_reason;
        paVar1 = &(__return_storage_ptr__->m_message).field_2;
        (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58.m_message._M_dataplus._M_p == paVar2) {
          paVar1->_M_allocated_capacity =
               CONCAT71(local_58.m_message.field_2._M_allocated_capacity._1_7_,
                        local_58.m_message.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) =
               local_58.m_message.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_58.m_message._M_dataplus._M_p
          ;
          (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
               CONCAT71(local_58.m_message.field_2._M_allocated_capacity._1_7_,
                        local_58.m_message.field_2._M_local_buf[0]);
        }
        (__return_storage_ptr__->m_message)._M_string_length = local_58.m_message._M_string_length;
        local_58.m_message._M_string_length = 0;
        local_58.m_message.field_2._M_local_buf[0] = '\0';
        local_58.m_message._M_dataplus._M_p = (pointer)paVar2;
        goto LAB_00359370;
      }
      local_78[0] = local_68;
      pcVar5 = (layerClassName->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,pcVar5,pcVar5 + layerClassName->_M_string_length);
      std::__cxx11::string::append((char *)local_78);
      plVar11 = (long *)std::__cxx11::string::_M_append
                                  ((char *)local_78,(ulong)(layerName->_M_dataplus)._M_p);
      puVar13 = (ulong *)(plVar11 + 2);
      if ((ulong *)*plVar11 == puVar13) {
        local_108 = *puVar13;
        lStack_100 = plVar11[3];
        local_118 = &local_108;
      }
      else {
        local_108 = *puVar13;
        local_118 = (ulong *)*plVar11;
      }
      local_110 = plVar11[1];
      *plVar11 = (long)puVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_118);
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_c8 = *plVar15;
        lStack_c0 = plVar11[3];
        local_d8 = &local_c8;
      }
      else {
        local_c8 = *plVar15;
        local_d8 = (long *)*plVar11;
      }
      local_d0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_d8,(ulong)(weightName->_M_dataplus)._M_p);
      local_f8 = &local_e8;
      plVar15 = plVar11 + 2;
      if ((long *)*plVar11 == plVar15) {
        local_e8 = *plVar15;
        lStack_e0 = plVar11[3];
      }
      else {
        local_e8 = *plVar15;
        local_f8 = (long *)*plVar11;
      }
      local_f0 = plVar11[1];
      *plVar11 = (long)plVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_f8);
      puVar13 = (ulong *)(plVar11 + 2);
      if ((ulong *)*plVar11 == puVar13) {
        local_1b0 = *puVar13;
        lStack_1a8 = plVar11[3];
        local_1c0 = &local_1b0;
      }
      else {
        local_1b0 = *puVar13;
        local_1c0 = (ulong *)*plVar11;
      }
      local_1b8 = plVar11[1];
      *plVar11 = (long)puVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      cVar17 = '\x01';
      if (9 < uVar18) {
        uVar9 = uVar18;
        cVar7 = '\x04';
        do {
          cVar17 = cVar7;
          if (uVar9 < 100) {
            cVar17 = cVar17 + -2;
            goto LAB_00359823;
          }
          if (uVar9 < 1000) {
            cVar17 = cVar17 + -1;
            goto LAB_00359823;
          }
          if (uVar9 < 10000) goto LAB_00359823;
          bVar8 = 99999 < uVar9;
          uVar9 = uVar9 / 10000;
          cVar7 = cVar17 + '\x04';
        } while (bVar8);
        cVar17 = cVar17 + '\x01';
      }
LAB_00359823:
      local_b8 = local_a8;
      std::__cxx11::string::_M_construct((ulong)&local_b8,cVar17);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_b8,local_b0,uVar18);
      uVar18 = CONCAT44(uStack_ac,local_b0) + local_1b8;
      uVar9 = 0xf;
      if (local_1c0 != &local_1b0) {
        uVar9 = local_1b0;
      }
      if (uVar9 < uVar18) {
        uVar9 = 0xf;
        if (local_b8 != local_a8) {
          uVar9 = local_a8[0];
        }
        if (uVar9 < uVar18) goto LAB_003598a8;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_1c0);
      }
      else {
LAB_003598a8:
        puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1c0,(ulong)local_b8);
      }
      local_160 = &local_150;
      plVar11 = puVar10 + 2;
      if ((long *)*puVar10 == plVar11) {
        local_150 = *plVar11;
        uStack_148 = puVar10[3];
      }
      else {
        local_150 = *plVar11;
        local_160 = (long *)*puVar10;
      }
      local_158 = puVar10[1];
      *puVar10 = plVar11;
      puVar10[1] = 0;
      *(undefined1 *)plVar11 = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_160);
      puVar13 = (ulong *)(plVar11 + 2);
      if ((ulong *)*plVar11 == puVar13) {
        local_170 = *puVar13;
        lStack_168 = plVar11[3];
        local_180 = &local_170;
      }
      else {
        local_170 = *puVar13;
        local_180 = (ulong *)*plVar11;
      }
      local_178 = plVar11[1];
      *plVar11 = (long)puVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      cVar17 = '\x01';
      if (9 < local_120) {
        uVar16 = local_120;
        cVar7 = '\x04';
        do {
          cVar17 = cVar7;
          if (uVar16 < 100) {
            cVar17 = cVar17 + -2;
            goto LAB_003599c7;
          }
          if (uVar16 < 1000) {
            cVar17 = cVar17 + -1;
            goto LAB_003599c7;
          }
          if (uVar16 < 10000) goto LAB_003599c7;
          bVar8 = 99999 < uVar16;
          uVar16 = uVar16 / 10000;
          cVar7 = cVar17 + '\x04';
        } while (bVar8);
        cVar17 = cVar17 + '\x01';
      }
LAB_003599c7:
      local_98 = local_88;
      std::__cxx11::string::_M_construct((ulong)&local_98,cVar17);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_98,local_90,local_120);
      uVar18 = CONCAT44(uStack_8c,local_90) + local_178;
      uVar9 = 0xf;
      if (local_180 != &local_170) {
        uVar9 = local_170;
      }
      if (uVar9 < uVar18) {
        uVar9 = 0xf;
        if (local_98 != local_88) {
          uVar9 = local_88[0];
        }
        if (uVar9 < uVar18) goto LAB_00359a4a;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_180);
      }
      else {
LAB_00359a4a:
        puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_98);
      }
      local_1a0 = &local_190;
      plVar11 = puVar10 + 2;
      if ((long *)*puVar10 == plVar11) {
        local_190 = *plVar11;
        uStack_188 = puVar10[3];
      }
      else {
        local_190 = *plVar11;
        local_1a0 = (long *)*puVar10;
      }
      local_198 = puVar10[1];
      *puVar10 = plVar11;
      puVar10[1] = 0;
      *(undefined1 *)plVar11 = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a0);
      psVar14 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_140.field_2._M_allocated_capacity = *psVar14;
        local_140.field_2._8_8_ = puVar10[3];
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      }
      else {
        local_140.field_2._M_allocated_capacity = *psVar14;
        local_140._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_140._M_string_length = puVar10[1];
      *puVar10 = psVar14;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      if (local_1a0 != &local_190) {
        operator_delete(local_1a0,local_190 + 1);
      }
      if (local_98 != local_88) {
        operator_delete(local_98,local_88[0] + 1);
      }
      if (local_180 != &local_170) {
        operator_delete(local_180,local_170 + 1);
      }
      if (local_160 != &local_150) {
        operator_delete(local_160,local_150 + 1);
      }
      if (local_b8 != local_a8) {
        operator_delete(local_b8,local_a8[0] + 1);
      }
      if (local_1c0 != &local_1b0) {
        operator_delete(local_1c0,local_1b0 + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      if (local_118 != &local_108) {
        operator_delete(local_118,local_108 + 1);
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p == &local_140.field_2) goto LAB_00359370;
    }
  }
  else {
    pcVar5 = (layerClassName->_M_dataplus)._M_p;
    local_1c0 = &local_1b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c0,pcVar5,pcVar5 + layerClassName->_M_string_length);
    std::__cxx11::string::append((char *)&local_1c0);
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_1c0,(ulong)(layerName->_M_dataplus)._M_p);
    plVar11 = puVar10 + 2;
    if ((long *)*puVar10 == plVar11) {
      local_150 = *plVar11;
      uStack_148 = puVar10[3];
      local_160 = &local_150;
    }
    else {
      local_150 = *plVar11;
      local_160 = (long *)*puVar10;
    }
    local_158 = puVar10[1];
    *puVar10 = plVar11;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_160);
    puVar13 = (ulong *)(plVar11 + 2);
    if ((ulong *)*plVar11 == puVar13) {
      local_170 = *puVar13;
      lStack_168 = plVar11[3];
      local_180 = &local_170;
    }
    else {
      local_170 = *puVar13;
      local_180 = (ulong *)*plVar11;
    }
    local_178 = plVar11[1];
    *plVar11 = (long)puVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_180,(ulong)(weightName->_M_dataplus)._M_p);
    plVar11 = puVar10 + 2;
    if ((long *)*puVar10 == plVar11) {
      local_190 = *plVar11;
      uStack_188 = puVar10[3];
      local_1a0 = &local_190;
    }
    else {
      local_190 = *plVar11;
      local_1a0 = (long *)*puVar10;
    }
    local_198 = puVar10[1];
    *puVar10 = plVar11;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_1a0);
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    psVar14 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_140.field_2._M_allocated_capacity = *psVar14;
      local_140.field_2._8_8_ = plVar11[3];
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar14;
      local_140._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_140._M_string_length = plVar11[1];
    *plVar11 = (long)psVar14;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    if (local_1a0 != &local_190) {
      operator_delete(local_1a0,local_190 + 1);
    }
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    if (local_160 != &local_150) {
      operator_delete(local_160,local_150 + 1);
    }
    if (local_1c0 != &local_1b0) {
      operator_delete(local_1c0,local_1b0 + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_140);
LAB_00359353:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p == &local_140.field_2) goto LAB_00359370;
  }
  operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
LAB_00359370:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.m_message._M_dataplus._M_p != &local_58.m_message.field_2) {
    operator_delete(local_58.m_message._M_dataplus._M_p,
                    CONCAT71(local_58.m_message.field_2._M_allocated_capacity._1_7_,
                             local_58.m_message.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateGeneralWeightParams(const CoreML::Specification::WeightParams& weight,
                                          const uint64_t expectedUnits,
                                          const uint64_t outChannels,
                                          const std::string& layerClassName,
                                          const std::string& layerName,
                                          const std::string& weightName){
    // Validate a 2D WeightParam
    Result r;
    WeightParamType wType = valueType(weight);
    uint64_t size = 0;
    if (wType == FLOAT32 || wType == FLOAT16){
        if (wType == FLOAT32){
            size = static_cast<uint64_t>(weight.floatvalue().size());
        } else {
            size = static_cast<uint64_t>(weight.float16value().size()/2);
        }
        if (size != expectedUnits){
            const std::string err = layerClassName + "Layer '" + layerName + "' has incorrect " +
            weightName + " size " + std::to_string(size) + " (expected " +
            std::to_string(expectedUnits) + ").";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    } else if (wType == QUINT){
        if (!CoreML::hasSufficientBytesInQuantizedWeightParam(weight, expectedUnits)){
            const std::string err = layerClassName + "Layer '" + layerName +
            "' has insufficient bytes for quantized " + weightName + " with " +
            std::to_string(expectedUnits) + "units.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (!CoreML::hasValidQuantizationParams(weight, (int) outChannels)){
            const std::string err = layerClassName + "Layer '" + layerName +
            "' has invalid quantization parameters for quantized " + weightName + ".";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    } else if (wType == UNSPECIFIED){
        const std::string err = layerClassName + "Layer '" + layerName + "' has unspecified " + weightName + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    } else { // EMPTY
        const std::string err = layerClassName + "Layer '" + layerName + "' has empty " + weightName + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return r;
}